

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_filename.c
# Opt level: O0

int64_t file_skip(archive_conflict *a,void *client_data,int64_t request)

{
  long in_RSI;
  read_file_data *mine;
  undefined8 local_8;
  
  if (*(char *)(in_RSI + 0x1c) == '\0') {
    local_8 = 0;
  }
  else {
    local_8 = file_skip_lseek(a,client_data,request);
  }
  return local_8;
}

Assistant:

static int64_t
file_skip(struct archive *a, void *client_data, int64_t request)
{
	struct read_file_data *mine = (struct read_file_data *)client_data;

	/* Delegate skip requests. */
	if (mine->use_lseek)
		return (file_skip_lseek(a, client_data, request));

	/* If we can't skip, return 0; libarchive will read+discard instead. */
	return (0);
}